

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadMaterialLibrary(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar4;
  ulong uVar5;
  pointer ppVar6;
  mapped_type_conflict1 *pmVar7;
  undefined4 extraout_var_01;
  allocator local_2d1;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  ostringstream local_270 [8];
  ostringstream strStream;
  _Self local_f8;
  _Self local_f0;
  iterator it;
  undefined1 local_98 [4];
  int attrName;
  string name;
  undefined1 local_70 [8];
  string id;
  int attrID;
  undefined1 local_40 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  names;
  ColladaParser *this_local;
  
  names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)local_40);
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) goto LAB_0060a9b7;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"material");
        if (bVar1) {
          id.field_2._8_4_ = GetAttribute(this,"id");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                            (this->mReader,(ulong)(uint)id.field_2._8_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_70,(char *)CONCAT44(extraout_var,iVar3),
                     (allocator *)(name.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string((string *)local_98);
          uVar2 = TestAttribute(this,"name");
          if (-1 < (int)uVar2) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
            std::__cxx11::string::operator=
                      ((string *)local_98,(char *)CONCAT44(extraout_var_00,iVar3));
          }
          it._M_node = (_Base_ptr)0x0;
          Collada::Material::Material((Material *)&it);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                   ::operator[](&this->mMaterialLibrary,(key_type *)local_70);
          Collada::Material::operator=(pmVar4,(Material *)&it);
          Collada::Material::~Material((Material *)&it);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            local_f0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_40,(key_type *)local_98);
            local_f8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)local_40);
            bVar1 = std::operator!=(&local_f0,&local_f8);
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream(local_270);
              ppVar6 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                       ::operator->(&local_f0);
              iVar3 = ppVar6->second + 1;
              ppVar6->second = iVar3;
              std::ostream::operator<<(local_270,iVar3);
              std::__cxx11::ostringstream::str();
              std::operator+(&local_290," ",&local_2b0);
              std::__cxx11::string::append((string *)local_98);
              std::__cxx11::string::~string((string *)&local_290);
              std::__cxx11::string::~string((string *)&local_2b0);
              std::__cxx11::ostringstream::~ostringstream(local_270);
            }
            else {
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)local_40,(key_type *)local_98);
              *pmVar7 = 0;
            }
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                     ::operator[](&this->mMaterialLibrary,(key_type *)local_70);
            std::__cxx11::string::operator=((string *)pmVar4,(string *)local_98);
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Material>_>_>
                   ::operator[](&this->mMaterialLibrary,(key_type *)local_70);
          ReadMaterial(this,pmVar4);
          std::__cxx11::string::~string((string *)local_98);
          std::__cxx11::string::~string((string *)local_70);
        }
        else {
          SkipElement(this);
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"library_materials");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2d0,"Expected end of <library_materials> element.",&local_2d1);
      ThrowException(this,&local_2d0);
    }
LAB_0060a9b7:
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_40);
  }
  return;
}

Assistant:

void ColladaParser::ReadMaterialLibrary()
{
    if (mReader->isEmptyElement())
        return;

    std::map<std::string, int> names;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("material"))
            {
                // read ID. By now you probably know my opinion about this "specification"
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                std::string name;
                int attrName = TestAttribute("name");
                if (attrName >= 0)
                    name = mReader->getAttributeValue(attrName);

                // create an entry and store it in the library under its ID
                mMaterialLibrary[id] = Material();

                if (!name.empty())
                {
                    std::map<std::string, int>::iterator it = names.find(name);
                    if (it != names.end())
                    {
                        std::ostringstream strStream;
                        strStream << ++it->second;
                        name.append(" " + strStream.str());
                    }
                    else
                    {
                        names[name] = 0;
                    }

                    mMaterialLibrary[id].mName = name;
                }

                ReadMaterial(mMaterialLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_materials") != 0)
                ThrowException("Expected end of <library_materials> element.");

            break;
        }
    }
}